

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_inspect(REF_CAVITY ref_cavity)

{
  uint uVar1;
  uint local_a8;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nodes [27];
  REF_INT i;
  REF_INT cell;
  REF_INT item;
  REF_INT node;
  REF_INT face;
  REF_CAVITY ref_cavity_local;
  
  if (ref_cavity == (REF_CAVITY)0x0) {
    ref_cavity_local._4_4_ = 2;
  }
  else {
    printf("node %d\nnface = %d maxface = %d blankface = %d\n",(ulong)(uint)ref_cavity->node,
           (ulong)(uint)ref_cavity->nface,(ulong)(uint)ref_cavity->maxface,
           (ulong)(uint)ref_cavity->blankface);
    for (item = 0; item < ref_cavity->maxface; item = item + 1) {
      printf(" f2n[%d] = ",(ulong)(uint)item);
      for (cell = 0; cell < 3; cell = cell + 1) {
        printf(" %d ",(ulong)(uint)ref_cavity->f2n[cell + item * 3]);
      }
      printf("\n");
    }
    ref_cavity_local._4_4_ = ref_list_inspect(ref_cavity->tet_list);
    if (ref_cavity_local._4_4_ == 0) {
      if (ref_cavity->surf_node == -1) {
        local_a8 = ref_cavity->node;
      }
      else {
        local_a8 = ref_cavity->surf_node;
      }
      printf("seg node %d\nnseg = %d maxseg = %d blankseg = %d\n",(ulong)local_a8,
             (ulong)(uint)ref_cavity->nseg,(ulong)(uint)ref_cavity->maxseg,
             (ulong)(uint)ref_cavity->blankseg);
      for (item = 0; item < ref_cavity->maxseg; item = item + 1) {
        printf(" s2n[%d] = ",(ulong)(uint)item);
        for (cell = 0; cell < 3; cell = cell + 1) {
          printf(" %d ",(ulong)(uint)ref_cavity->s2n[cell + item * 3]);
        }
        printf("\n");
      }
      ref_cavity_local._4_4_ = ref_list_inspect(ref_cavity->tri_list);
      if (ref_cavity_local._4_4_ == 0) {
        for (i = 0; i < ref_cavity->tri_list->n; i = i + 1) {
          nodes[0x1a] = ref_cavity->tri_list->value[i];
          uVar1 = ref_cell_nodes(ref_cavity->ref_grid->cell[3],nodes[0x1a],
                                 &ref_private_macro_code_rss_1);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x7f,"ref_cavity_inspect",(ulong)uVar1,"cell");
            return uVar1;
          }
          for (nodes[0x19] = 0; nodes[0x19] < 4; nodes[0x19] = nodes[0x19] + 1) {
            printf(" %d",(ulong)(uint)(&ref_private_macro_code_rss_1)[nodes[0x19]]);
          }
          printf("\n");
        }
        ref_cavity_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x7b,"ref_cavity_inspect",(ulong)ref_cavity_local._4_4_,"insp");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x71
             ,"ref_cavity_inspect",(ulong)ref_cavity_local._4_4_,"insp");
    }
  }
  return ref_cavity_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_inspect(REF_CAVITY ref_cavity) {
  REF_INT face, node;
  REF_INT item, cell, i, nodes[REF_CELL_MAX_SIZE_PER];

  if (NULL == (void *)ref_cavity) return REF_NULL;

  printf("node %d\nnface = %d maxface = %d blankface = %d\n",
         ref_cavity_node(ref_cavity), ref_cavity_nface(ref_cavity),
         ref_cavity_maxface(ref_cavity), ref_cavity_blankface(ref_cavity));
  for (face = 0; face < ref_cavity_maxface(ref_cavity); face++) {
    printf(" f2n[%d] = ", face);
    for (node = 0; node < 3; node++)
      printf(" %d ", ref_cavity_f2n(ref_cavity, node, face));
    printf("\n");
  }
  RSS(ref_list_inspect(ref_cavity_tet_list(ref_cavity)), "insp");
  printf("seg node %d\nnseg = %d maxseg = %d blankseg = %d\n",
         ref_cavity_seg_node(ref_cavity), ref_cavity_nseg(ref_cavity),
         ref_cavity_maxseg(ref_cavity), ref_cavity_blankseg(ref_cavity));
  for (face = 0; face < ref_cavity_maxseg(ref_cavity); face++) {
    printf(" s2n[%d] = ", face);
    for (node = 0; node < 3; node++)
      printf(" %d ", ref_cavity_s2n(ref_cavity, node, face));
    printf("\n");
  }
  RSS(ref_list_inspect(ref_cavity_tri_list(ref_cavity)), "insp");
  each_ref_list_item(ref_cavity_tri_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tri_list(ref_cavity), item);
    RSS(ref_cell_nodes(ref_grid_tri(ref_cavity_grid(ref_cavity)), cell, nodes),
        "cell");
    for (i = 0; i < 4; i++) printf(" %d", nodes[i]);
    printf("\n");
  }
  return REF_SUCCESS;
}